

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O3

void __thiscall w3Interp::f64_Convert_i32s(w3Interp *this)

{
  int iVar1;
  pointer pwVar2;
  Value *pVVar3;
  
  pVVar3 = w3Stack::value(&this->super_w3Stack,Tag_i32);
  iVar1 = pVVar3->i32;
  w3Stack::AssertTopIsValue(&this->super_w3Stack);
  pwVar2 = (this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
           super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pwVar2[-1].value.tag = Tag_f64;
  pwVar2[-1].value.value.f64 = (double)iVar1;
  return;
}

Assistant:

INTERP (f64_Convert_i32s)
{
    set_f64 ((double)i32 ());
}